

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O2

ssize_t __thiscall HPack::BitIStream::read(BitIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  quint64 qVar1;
  uchar *puVar2;
  ulong uVar3;
  Data *pDVar4;
  bool bVar5;
  quint64 qVar6;
  ssize_t sVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar8;
  uchar *dstPtr;
  void *__buf_00;
  undefined4 in_register_00000034;
  QByteArray *outputBuffer;
  ulong uVar9;
  long in_FS_OFFSET;
  quint32 len;
  uchar compressed;
  BitIStream local_48;
  long local_28;
  
  outputBuffer = (QByteArray *)CONCAT44(in_register_00000034,__fd);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = this->offset;
  dstPtr = &compressed;
  compressed = '\0';
  qVar6 = peekBits<unsigned_char>(this,qVar1,1,dstPtr);
  if (qVar6 == 1) {
    bVar5 = skipBits(this,1);
    if (!bVar5) goto LAB_001c9d89;
    this->streamError = NoError;
    len = 0;
    sVar7 = read(this,(int)&len,__buf_00,(size_t)dstPtr);
    if ((char)sVar7 != '\0') {
      uVar9 = (ulong)len;
      puVar2 = this->first;
      uVar3 = this->offset;
      if (uVar9 <= ((long)this->last - (long)puVar2) * 8 - uVar3 >> 3) {
        if (compressed == '\0') {
          QByteArray::QByteArray((QByteArray *)&local_48,(char *)(puVar2 + (uVar3 >> 3)),uVar9);
          pDVar4 = (outputBuffer->d).d;
          puVar2 = (uchar *)(outputBuffer->d).ptr;
          (outputBuffer->d).d = (Data *)local_48.first;
          (outputBuffer->d).ptr = (char *)local_48.last;
          qVar1 = (outputBuffer->d).size;
          (outputBuffer->d).size = local_48.offset;
          local_48.first = (uchar *)pDVar4;
          local_48.last = puVar2;
          local_48.offset = qVar1;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
          uVar8 = extraout_var_00;
        }
        else {
          local_48.first = puVar2 + (uVar3 >> 3);
          local_48.last =
               (uchar *)((long)&(((Data *)local_48.first)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i + uVar9);
          local_48.offset = 0;
          local_48.streamError = NoError;
          local_48._28_4_ = 0xaaaaaaaa;
          bVar5 = huffman_decode_string(&local_48,outputBuffer);
          uVar8 = extraout_var;
          if (!bVar5) {
            this->streamError = CompressionError;
            goto LAB_001c9dd9;
          }
        }
        this->offset = this->offset + uVar9 * 8;
        sVar7 = CONCAT71(uVar8,1);
        goto LAB_001c9ddf;
      }
      this->streamError = NotEnoughData;
    }
LAB_001c9dd9:
    this->offset = qVar1;
  }
  else {
LAB_001c9d89:
    this->streamError = NotEnoughData;
  }
  sVar7 = 0;
LAB_001c9ddf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return sVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool BitIStream::read(QByteArray *dstPtr)
{
    Q_ASSERT(dstPtr);
    QByteArray &dst = *dstPtr;
    //5.2 String Literal Representation
    //
    // Header field names and header field values can be represented as string literals.
    // A string literal is compressed as a sequence of octets, either by directly encoding
    // the string literal's octets or by using a Huffman code.

    // We update the offset _only_ if the read was successful.

    const quint64 oldOffset = offset;
    uchar compressed = 0;
    if (peekBits(offset, 1, &compressed) != 1 || !skipBits(1)) {
        setError(Error::NotEnoughData);
        return false;
    }

    setError(Error::NoError);

    quint32 len = 0;
    if (read(&len)) {
        Q_ASSERT(!(offset % 8));
        if (len <= (bitLength() - offset) / 8) { // We have enough data to read a string ...
            if (!compressed) {
                // Now good news, integer always ends on a byte boundary.
                // We can read 'len' bytes without any bit magic.
                const char *src = reinterpret_cast<const char *>(first + offset / 8);
                dst = QByteArray(src, len);
                offset += quint64(len) * 8;
                return true;
            }

            BitIStream slice(first + offset / 8, first + offset / 8 + len);
            if (huffman_decode_string(slice, &dst)) {
                offset += quint64(len) * 8;
                return true;
            }

            setError(Error::CompressionError);
        } else {
            setError(Error::NotEnoughData);
        }
    } // else the exact reason was set by read(quint32).

    offset = oldOffset;
    return false;
}